

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O2

void __thiscall
Liby::
BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
::push_notify(BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
              *this,const_reference_type e)

{
  std::mutex::lock(&this->mutex_);
  std::__cxx11::
  list<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>>>
  ::
  emplace_back<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>const&>
            ((list<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,Liby::EventLoop*,std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>>>>
              *)&this->queue_,e);
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void push_notify(const_reference_type e) {
        std::lock_guard<std::mutex> G_(mutex_);
        queue_.emplace_back(e);
        cond_.notify_one();
    }